

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# haar1.cpp
# Opt level: O1

void detectAndDisplay(Mat *frame)

{
  int in_R8D;
  long lVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> face;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> fist;
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> hand;
  Mat mask;
  Mat frame_gray;
  _InputArray local_1e8;
  undefined8 uStack_1d0;
  _InputArray local_1c0;
  void *local_1a8;
  void *pvStack_1a0;
  long local_198;
  void *local_188;
  void *pvStack_180;
  long local_178;
  void *local_168;
  void *pvStack_160;
  long local_158;
  undefined4 local_150;
  undefined4 local_14c;
  undefined4 local_148;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  undefined4 local_128;
  undefined4 local_124;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  Mat local_f0 [96];
  Mat local_90 [96];
  
  local_168 = (void *)0x0;
  pvStack_160 = (void *)0x0;
  local_158 = 0;
  local_178 = 0;
  local_188 = (void *)0x0;
  pvStack_180 = (void *)0x0;
  local_198 = 0;
  local_1a8 = (void *)0x0;
  pvStack_1a0 = (void *)0x0;
  cv::Mat::Mat(local_90);
  cv::Mat::Mat(local_f0);
  local_1e8.sz.width = 0;
  local_1e8.sz.height = 0;
  local_1e8.flags = 0x1010000;
  local_1c0.sz.width = 0;
  local_1c0.sz.height = 0;
  local_1c0.flags = 0x2010000;
  local_1e8.obj = frame;
  local_1c0.obj = local_f0;
  cv::cvtColor((cv *)&local_1e8,&local_1c0,(_OutputArray *)0x6,0,in_R8D);
  iVar3 = 0;
  local_1e8.sz.width = 0;
  local_1e8.sz.height = 0;
  local_1e8.flags = 0x1010000;
  local_f8 = 0x1e0000001e;
  local_100 = 0;
  local_1e8.obj = frame;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,hand_classifier,&local_1e8,&local_168,2,2,&local_f8,&local_100);
  if (pvStack_160 != local_168) {
    uVar2 = 0;
    lVar1 = 0xc;
    iVar3 = 0;
    do {
      if ((*(int *)((long)local_168 + lVar1 + -4) < 0xb0) ||
         (*(int *)((long)local_168 + lVar1) < 0xb0)) {
        iVar3 = iVar3 + 1;
      }
      else {
        local_1c0.sz.width = 0;
        local_1c0.sz.height = 0;
        local_1c0.flags = 0x3010000;
        local_130 = *(undefined4 *)((long)local_168 + lVar1 + -0xc);
        local_12c = *(undefined4 *)((long)local_168 + lVar1 + -8);
        local_128 = *(undefined4 *)((long)local_168 + lVar1 + -4);
        local_124 = *(undefined4 *)((long)local_168 + lVar1);
        local_1e8.flags = 0;
        local_1e8._4_4_ = 0x406fe000;
        local_1e8.obj = (void *)0x406fe00000000000;
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0x406fe000;
        uStack_1d0 = 0;
        local_1c0.obj = frame;
        cv::rectangle(&local_1c0,&local_130,&local_1e8,5,8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"palm",4);
        std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)pvStack_160 - (long)local_168 >> 4));
  }
  bVar4 = pvStack_160 == local_168;
  local_1e8.sz.width = 0;
  local_1e8.sz.height = 0;
  local_1e8.flags = 0x1010000;
  local_108 = 0x1e0000001e;
  local_110 = 0;
  local_1e8.obj = frame;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,fist_classifier,&local_1e8,&local_188,2,2,&local_108,&local_110);
  if (pvStack_180 != local_188) {
    lVar1 = 0xc;
    uVar2 = 0;
    do {
      if ((0x7d < *(int *)((long)local_188 + lVar1)) &&
         (0x7d < *(int *)((long)local_188 + lVar1 + -4))) {
        local_1c0.sz.width = 0;
        local_1c0.sz.height = 0;
        local_1c0.flags = 0x3010000;
        local_140 = *(undefined4 *)((long)local_188 + lVar1 + -0xc);
        local_13c = *(undefined4 *)((long)local_188 + lVar1 + -8);
        local_138 = *(undefined4 *)((long)local_188 + lVar1 + -4);
        local_134 = *(undefined4 *)((long)local_188 + lVar1);
        local_1e8.flags = 0;
        local_1e8._4_4_ = 0x406fe000;
        local_1e8.obj = (void *)0x406fe00000000000;
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0x406fe000;
        uStack_1d0 = 0;
        local_1c0.obj = frame;
        cv::rectangle(&local_1c0,&local_140,&local_1e8,5,8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"fist",4);
        std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)pvStack_180 - (long)local_188 >> 4));
  }
  bVar5 = pvStack_180 == local_188;
  local_1e8.sz.width = 0;
  local_1e8.sz.height = 0;
  local_1e8.flags = 0x1010000;
  local_1e8.obj = local_f0;
  local_118 = 0x1e0000001e;
  local_120 = 0;
  cv::CascadeClassifier::detectMultiScale
            (0x9999999a,face_classifier,&local_1e8,&local_1a8,2,2,&local_118,&local_120);
  if (pvStack_1a0 != local_1a8) {
    lVar1 = 0xc;
    uVar2 = 0;
    do {
      if ((0x96 < *(int *)((long)local_1a8 + lVar1)) &&
         (0x96 < *(int *)((long)local_1a8 + lVar1 + -4))) {
        local_1c0.sz.width = 0;
        local_1c0.sz.height = 0;
        local_1c0.flags = 0x3010000;
        local_150 = *(undefined4 *)((long)local_1a8 + lVar1 + -0xc);
        local_14c = *(undefined4 *)((long)local_1a8 + lVar1 + -8);
        local_148 = *(undefined4 *)((long)local_1a8 + lVar1 + -4);
        local_144 = *(undefined4 *)((long)local_1a8 + lVar1);
        local_1e8.flags = 0;
        local_1e8._4_4_ = 0x406fe000;
        local_1e8.obj = (Mat *)0x406fe00000000000;
        local_1e8.sz.width = 0;
        local_1e8.sz.height = 0;
        uStack_1d0 = 0;
        local_1c0.obj = frame;
        cv::rectangle(&local_1c0,&local_150,&local_1e8,5,8,0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"face",4);
        std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
        std::ostream::put(-0x10);
        std::ostream::flush();
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (ulong)((long)pvStack_1a0 - (long)local_1a8 >> 4));
  }
  if ((uint)(pvStack_1a0 == local_1a8) + (uint)bVar5 + iVar3 + (uint)bVar4 == 3) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&outfile,"none",4);
    std::ios::widen((char)*(undefined8 *)(outfile + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
  }
  local_1e8.sz.width = 0;
  local_1e8.sz.height = 0;
  local_1e8.flags = 0x1010000;
  local_1e8.obj = frame;
  cv::imshow((string *)&window_name_abi_cxx11_,&local_1e8);
  cv::Mat::~Mat(local_f0);
  cv::Mat::~Mat(local_90);
  if (local_1a8 != (void *)0x0) {
    operator_delete(local_1a8,local_198 - (long)local_1a8);
  }
  if (local_188 != (void *)0x0) {
    operator_delete(local_188,local_178 - (long)local_188);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168,local_158 - (long)local_168);
  }
  return;
}

Assistant:

void detectAndDisplay( Mat frame )
{
  int s1 = 0;
  std::vector<Rect> hand;
  std::vector<Rect> fist;
  std::vector<Rect> face;
  std::vector<Rect> left;
  Mat frame_gray,mask;
  //mask = frame;

  //blur(frame,frame,Size(3,3)); 
  cvtColor( frame, mask ,COLOR_BGR2GRAY );
  //equalizeHist( frame, frame_gray );
  //threshold( frame, frame_gray, threshold_value, max_binary_value, threshold_type );
  //threshold(frame,frame_gray,150,180,THRESH_BINARY);
  //adaptiveThreshold(frame, frame_gray, 255 , ADAPTIVE_THRESH_GAUSSIAN_C, THRESH_BINARY ,11,2);
  //imshow( "Window-2", frame_gray );
  hand_classifier.detectMultiScale( frame, hand, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for( size_t i = 0; i < hand.size(); i++ )
{
//Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
//cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,hand[i]);
//cout<<hand[i]<<"\n";
if (hand[i].width>175 && hand[i].height>175)// cout<<"palm"<<"width:  "<<hand[i].width<<"  height: "<<hand[i].height<<"\n";
{
//cout<<"palm"<<"\n";
Point center(hand[i].x *1.5+ hand[i].width*0.5, hand[i].y*1.5 + hand[i].height*0.5);
cv::rectangle(frame, hand[i], cv::Scalar(255, 255, 255), 5);
outfile << "palm" << endl;
}
else s1++;
}

if (hand.size()==0) s1++;

//fist_classifier.detectMultiScale( frame_gray, fist, 1.1, 2, 0|CV_HAAR_SCALE_IMAGE, Size(30, 30) );
fist_classifier.detectMultiScale( frame, fist, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30) );

for ( size_t i = 0; i < fist.size(); i++ )
{
//Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
//cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
//imshow(window_name,fist[i]);
if (fist[i].height>125 && fist[i].width > 125) //cout<<"fist-->height  "<<fist[i].height<<"  fist-->width  "<<fist[i].width <<"\n";
{
//cout<<"fist"<<"\n";
Point center(fist[i].x *1.5+ fist[i].width*0.5, fist[i].y*1.5 + fist[i].height*0.5);
cv::rectangle(frame, fist[i], cv::Scalar(255, 255, 255), 5);
outfile << "fist" << endl;
}
//else s1++;
}

if (fist.size()==0) s1++;

// smile classifier

//smile_classifier.detectMultiScale(frame,smile, 1.7, 22);
face_classifier.detectMultiScale( mask, face, 1.1, 2, 0|CASCADE_SCALE_IMAGE, Size(30, 30));

for (size_t i = 0;i< face.size();i++)
{
//Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);
if (face[i].height>150 && face[i].width>150)
{
Point center(face[i].x *2.5+ face[i].width*2.5, face[i].y*2.5 + face[i].height*2.5);  
cv::rectangle(frame, face[i], cv::Scalar(255, 255, 0), 5);
//cout<<"smile-->height  "<<face[i].height<<"smile-->width "<<face[i].width <<"\n";
//cout<<"***"<<"face"<<"\n";
outfile << "face" << endl;
}
//else s1++;
//imshow("new-window", frame_gray);
}

if (face.size()==0) s1++;

if (s1 == 3) 
{
  outfile<< "none" << endl;
  //cout<<"none"<<"\n";
}
//cout<<s1<<endl;
imshow( window_name, frame);
}